

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O0

void ddd::utils::read_vector<char>(vector<char,_std::allocator<char>_> *vec,istream *is)

{
  reference pvVar1;
  char *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  size_t size;
  istream *in_stack_ffffffffffffffd8;
  unsigned_long *in_stack_ffffffffffffffe0;
  
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x183048);
  read_value<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<char,_std::allocator<char>_>::resize(unaff_retaddr,(size_type)in_RDI);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[](in_RDI,0);
  std::istream::read(in_RSI,(long)pvVar1);
  return;
}

Assistant:

inline void read_vector(std::vector<T>& vec, std::istream& is) {
  vec.clear();
  size_t size = 0;
  read_value(size, is);
  vec.resize(size);
  is.read(reinterpret_cast<char*>(&vec[0]), sizeof(T) * size);
}